

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::MultiTexShader::MultiTexShader
          (MultiTexShader *this,deUint32 randSeed,int numUnits,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *unitTypes)

{
  vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_> *this_00;
  uint uVar1;
  _Alloc_hider _Var2;
  deUint32 dVar3;
  long *plVar4;
  void *__dest;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong **ppuVar7;
  VertexAttribute *pVVar8;
  float *pfVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  undefined1 **ppuVar13;
  undefined4 *puVar14;
  Vector<float,_3> *pVVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  Vector<float,_3> *pVVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  long lVar21;
  int col_7;
  ulong uVar22;
  float fVar23;
  float fVar24;
  string samplerName;
  string lookupCoord;
  string transformationName;
  string ndxStr;
  string lookupsStr;
  string transformationName_1;
  string colorMultiplier;
  string samplerName_1;
  Random rnd;
  Mat3 planarTrans;
  undefined1 local_608 [32];
  float fStack_5e8;
  undefined1 local_5e0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined4 local_598;
  pointer local_590;
  undefined1 local_588 [40];
  undefined1 local_560 [40];
  undefined1 local_538 [40];
  ulong local_510;
  Matrix<float,_3,_3> local_508;
  Matrix<float,_3,_3> local_4d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4a8;
  undefined1 local_4a0 [16];
  undefined1 *local_490;
  long lStack_488;
  ulong *local_478;
  long local_470;
  ulong local_468 [2];
  undefined4 local_458;
  undefined1 local_448 [40];
  vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *local_420;
  Matrix<float,_3,_3> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined4 local_3c8;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  Matrix<float,_3,_3> local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_390;
  undefined1 local_388 [32];
  float local_368;
  undefined1 local_358 [32];
  float local_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  VertexAttribute local_308 [2];
  ios_base local_298 [272];
  Matrix<float,_3,_3> local_188;
  deRandom local_158;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  
  local_590 = (unitTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_4a8 = unitTypes;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_148);
  local_608._0_8_ = local_608 + 0x10;
  local_608[0x10] = 'a';
  local_608._17_2_ = 0x705f;
  local_608._19_4_ = 0x7469736f;
  local_608[0x17] = 'i';
  local_608._24_2_ = 0x6e6f;
  local_608._8_4_ = 1.4013e-44;
  local_608._12_4_ = 0.0;
  local_608[0x1a] = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_308);
  local_308[0].type = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<((ShaderProgramDeclaration *)local_148,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
    operator_delete((void *)local_608._0_8_,
                    CONCAT17(local_608[0x17],
                             CONCAT43(local_608._19_4_,CONCAT21(local_608._17_2_,local_608[0x10])))
                    + 1);
  }
  local_608._0_8_ = local_608 + 0x10;
  local_608[0x10] = 'a';
  local_608._17_2_ = 0x635f;
  local_608._19_4_ = 0x64726f6f;
  local_608._8_4_ = 9.80909e-45;
  local_608._12_4_ = 0.0;
  local_608[0x17] = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>();
  local_308[0].type = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<((ShaderProgramDeclaration *)local_148,local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
    operator_delete((void *)local_608._0_8_,
                    CONCAT17(local_608[0x17],
                             CONCAT43(local_608._19_4_,CONCAT21(local_608._17_2_,local_608[0x10])))
                    + 1);
  }
  local_308[0].name._M_dataplus._M_p = local_308[0].name._M_dataplus._M_p & 0xffffff0000000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(VertexToFragmentVarying *)local_308);
  local_308[0].name._M_dataplus._M_p = local_308[0].name._M_dataplus._M_p & 0xffffffff00000000;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(FragmentOutput *)local_308);
  local_510 = (ulong)(uint)numUnits;
  if (0 < numUnits) {
    uVar22 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,0x660c64);
      local_608._0_8_ = local_608 + 0x10;
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        lVar17 = *plVar10;
        lVar16 = plVar4[3];
        local_608[0x10] = (undefined1)lVar17;
        local_608._17_2_ = (undefined2)((ulong)lVar17 >> 8);
        local_608._19_4_ = (undefined4)((ulong)lVar17 >> 0x18);
        local_608[0x17] = (undefined1)((ulong)lVar17 >> 0x38);
        local_608._24_2_ = (undefined2)lVar16;
        local_608[0x1a] = (undefined1)((ulong)lVar16 >> 0x10);
        local_608[0x1b] = (undefined1)((ulong)lVar16 >> 0x18);
        local_608._28_4_ = (undefined4)((ulong)lVar16 >> 0x20);
      }
      else {
        lVar17 = *plVar10;
        local_608[0x10] = (undefined1)lVar17;
        local_608._17_2_ = (undefined2)((ulong)lVar17 >> 8);
        local_608._19_4_ = (undefined4)((ulong)lVar17 >> 0x18);
        local_608[0x17] = (undefined1)((ulong)lVar17 >> 0x38);
        local_608._0_8_ = (long *)*plVar4;
      }
      local_608._8_4_ = (undefined4)plVar4[1];
      local_608._12_4_ = (undefined4)((ulong)plVar4[1] >> 0x20);
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x6424b9);
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      puVar11 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_5b8.field_2._M_allocated_capacity = *puVar11;
        local_5b8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_5b8.field_2._M_allocated_capacity = *puVar11;
        local_5b8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_5b8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_478 != local_468) {
        operator_delete(local_478,local_468[0] + 1);
      }
      uVar1 = local_590[uVar22];
      local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_608._0_8_,
                 (pointer)(local_608._0_8_ + CONCAT44(local_608._12_4_,local_608._8_4_)));
      local_308[0].type = uVar1 == 0xde1 ^ 0x29;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                ((ShaderProgramDeclaration *)local_148,(Uniform *)local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_308,local_5b8._M_dataplus._M_p,
                 local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
      local_308[0].type = 9;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                ((ShaderProgramDeclaration *)local_148,(Uniform *)local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
        operator_delete((void *)local_608._0_8_,
                        CONCAT17(local_608[0x17],
                                 CONCAT43(local_608._19_4_,
                                          CONCAT21(local_608._17_2_,local_608[0x10]))) + 1);
      }
      uVar22 = uVar22 + 1;
    } while (local_510 != uVar22);
  }
  local_608._0_8_ = local_608 + 0x10;
  local_5b8._M_dataplus._M_p = (pointer)0xa4;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)local_608,(ulong)&local_5b8);
  _Var2._M_p = local_5b8._M_dataplus._M_p;
  local_608._0_4_ = SUB84(__dest,0);
  local_608._4_4_ = (undefined4)((ulong)__dest >> 0x20);
  local_608[0x10] = SUB81(local_5b8._M_dataplus._M_p,0);
  local_608._17_2_ = (undefined2)((ulong)local_5b8._M_dataplus._M_p >> 8);
  local_608._19_4_ = (undefined4)((ulong)local_5b8._M_dataplus._M_p >> 0x18);
  local_608[0x17] = (undefined1)((ulong)local_5b8._M_dataplus._M_p >> 0x38);
  memcpy(__dest,
         "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
         ,0xa4);
  local_608._8_4_ = SUB84(_Var2._M_p,0);
  local_608._12_4_ = (undefined4)((ulong)_Var2._M_p >> 0x20);
  *((long)__dest + _Var2._M_p) = '\0';
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,CONCAT44(local_608._4_4_,local_608._0_4_),
             _Var2._M_p + CONCAT44(local_608._4_4_,local_608._0_4_));
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(VertexSource *)local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)CONCAT44(local_608._4_4_,local_608._0_4_) != local_608 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_608._4_4_,local_608._0_4_),
                    CONCAT17(local_608[0x17],
                             CONCAT43(local_608._19_4_,CONCAT21(local_608._17_2_,local_608[0x10])))
                    + 1);
  }
  local_608._0_8_ = local_608 + 0x10;
  local_608._8_4_ = 0.0;
  local_608._12_4_ = 0.0;
  local_608[0x10] = '\0';
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_allocated_capacity =
       local_5b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_478 = local_468;
  local_470 = 0;
  local_468[0] = local_468[0] & 0xffffffffffffff00;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
  std::ostream::operator<<(local_308,numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
  std::ios_base::~ios_base(local_298);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_448,0,(char *)0x0,0x642654);
  psVar12 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar12) {
    local_560._16_8_ = *psVar12;
    local_560._24_8_ = plVar4[3];
    local_560._0_8_ = local_560 + 0x10;
  }
  else {
    local_560._16_8_ = *psVar12;
    local_560._0_8_ = (size_type *)*plVar4;
  }
  local_560._8_8_ = plVar4[1];
  *plVar4 = (long)psVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_560);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  plVar10 = plVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar10) {
    local_3e8.field_2._8_8_ = plVar4[3];
    local_3e8.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar10;
    local_3e8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar10 >> 0x20);
  }
  else {
    local_3e8.field_2._M_allocated_capacity._0_4_ = (undefined4)*plVar10;
    local_3e8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar10 >> 0x20);
    local_3e8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_3e8._M_string_length._0_4_ = (undefined4)plVar4[1];
  local_3e8._M_string_length._4_4_ = (undefined4)((ulong)plVar4[1] >> 0x20);
  *plVar4 = (long)plVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_560._0_8_ != local_560 + 0x10) {
    operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if (0 < numUnits) {
    uVar22 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_308);
      std::ostream::operator<<(local_308,(int)uVar22);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_308);
      std::ios_base::~ios_base(local_298);
      std::operator+(&local_308[0].name,"u_sampler",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                     "u_trans",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560)
      ;
      local_4d8.m_data.m_data[0].m_data._0_8_ = local_4d8.m_data.m_data[1].m_data + 1;
      local_4d8.m_data.m_data[0].m_data[2] = 0.0;
      local_4d8.m_data.m_data[1].m_data[0] = 0.0;
      local_4d8.m_data.m_data[1].m_data._4_8_ =
           local_4d8.m_data.m_data[1].m_data._4_8_ & 0xffffffffffffff00;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_4d8);
      local_508.m_data.m_data[0].m_data._0_8_ = local_508.m_data.m_data[1].m_data + 1;
      plVar10 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar10) {
        local_508.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_508.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_508.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_508.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_508.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_508);
      local_4a0._0_8_ = &local_490;
      ppuVar13 = (undefined1 **)(plVar4 + 2);
      if ((undefined1 **)*plVar4 == ppuVar13) {
        local_490 = *ppuVar13;
        lStack_488 = plVar4[3];
      }
      else {
        local_490 = *ppuVar13;
        local_4a0._0_8_ = (undefined1 **)*plVar4;
      }
      local_4a0._8_8_ = plVar4[1];
      *plVar4 = (long)ppuVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(local_4a0);
      local_538._0_8_ = local_538 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_538._16_8_ = *psVar12;
        local_538._24_8_ = plVar4[3];
      }
      else {
        local_538._16_8_ = *psVar12;
        local_538._0_8_ = (size_type *)*plVar4;
      }
      local_538._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 (local_538,(ulong)local_308[0].name._M_dataplus._M_p);
      local_588._0_8_ = local_588 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_588._16_8_ = *psVar12;
        local_588._24_8_ = plVar4[3];
      }
      else {
        local_588._16_8_ = *psVar12;
        local_588._0_8_ = (size_type *)*plVar4;
      }
      local_588._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(local_588);
      local_5e0._0_8_ = local_5e0 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_5e0._16_8_ = *psVar12;
        local_5e0._24_8_ = plVar4[3];
      }
      else {
        local_5e0._16_8_ = *psVar12;
        local_5e0._0_8_ = (size_type *)*plVar4;
      }
      local_5e0._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append(local_608,local_5e0._0_8_);
      if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
        operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
      }
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
      }
      if ((undefined1 **)local_4a0._0_8_ != &local_490) {
        operator_delete((void *)local_4a0._0_8_,(ulong)(local_490 + 1));
      }
      if ((float *)local_508.m_data.m_data[0].m_data._0_8_ != local_508.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_508.m_data.m_data[0].m_data._0_8_,
                        local_508.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_4d8.m_data.m_data[0].m_data._0_8_ != local_4d8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_4d8.m_data.m_data[0].m_data._0_8_,
                        local_4d8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588,
                     "uniform mediump mat3 ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448)
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)local_588);
      local_5e0._0_8_ = local_5e0 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_5e0._16_8_ = *psVar12;
        local_5e0._24_8_ = plVar4[3];
      }
      else {
        local_5e0._16_8_ = *psVar12;
        local_5e0._0_8_ = (size_type *)*plVar4;
      }
      local_5e0._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_5b8,local_5e0._0_8_);
      if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
        operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
      }
      local_5e0._0_8_ = local_5e0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5e0,local_448._0_8_,(pointer)(local_448._0_8_ + local_448._8_8_));
      std::__cxx11::string::append((char *)local_5e0);
      if (local_590[uVar22] == 0xde1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_538,"vec2(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e0);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_538);
        psVar12 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar12) {
          local_588._16_8_ = *psVar12;
          local_588._24_8_ = plVar4[3];
          local_588._0_8_ = local_588 + 0x10;
        }
        else {
          local_588._16_8_ = *psVar12;
          local_588._0_8_ = (size_type *)*plVar4;
        }
        local_588._8_8_ = plVar4[1];
        *plVar4 = (long)psVar12;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_5e0,(string *)local_588);
        if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
          operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
        }
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     "\tcolor += ",&local_3e8);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_358);
      local_418.m_data.m_data[0].m_data._0_8_ = local_418.m_data.m_data[1].m_data + 1;
      plVar10 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar10) {
        local_418.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_418.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_418.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_418.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_418.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_418);
      local_3b8.m_data.m_data[0].m_data._0_8_ = local_3b8.m_data.m_data[1].m_data + 1;
      plVar10 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar10) {
        local_3b8.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_3b8.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_3b8.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_3b8.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_3b8.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_4d8.m_data.m_data[0].m_data._0_8_ = local_4d8.m_data.m_data[1].m_data + 1;
      puVar11 = (ulong *)(plVar4 + 2);
      if ((float *)*plVar4 == (float *)puVar11) {
        local_4d8.m_data.m_data[1].m_data._4_8_ = *puVar11;
        local_4d8.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_4d8.m_data.m_data[1].m_data._4_8_ = *puVar11;
        local_4d8.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_4d8.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)puVar11;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4d8,(ulong)local_308[0].name._M_dataplus._M_p);
      local_508.m_data.m_data[0].m_data._0_8_ = local_508.m_data.m_data[1].m_data + 1;
      plVar10 = plVar4 + 2;
      if ((float *)*plVar4 == (float *)plVar10) {
        local_508.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_508.m_data.m_data[2].m_data._0_8_ = plVar4[3];
      }
      else {
        local_508.m_data.m_data[1].m_data._4_8_ = *plVar10;
        local_508.m_data.m_data[0].m_data._0_8_ = (float *)*plVar4;
      }
      local_508.m_data.m_data._8_8_ = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_508);
      local_4a0._0_8_ = &local_490;
      ppuVar13 = (undefined1 **)(plVar4 + 2);
      if ((undefined1 **)*plVar4 == ppuVar13) {
        local_490 = *ppuVar13;
        lStack_488 = plVar4[3];
      }
      else {
        local_490 = *ppuVar13;
        local_4a0._0_8_ = (undefined1 **)*plVar4;
      }
      local_4a0._8_8_ = plVar4[1];
      *plVar4 = (long)ppuVar13;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append(local_4a0,local_5e0._0_8_);
      local_538._0_8_ = local_538 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_538._16_8_ = *psVar12;
        local_538._24_8_ = plVar4[3];
      }
      else {
        local_538._16_8_ = *psVar12;
        local_538._0_8_ = (size_type *)*plVar4;
      }
      local_538._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append(local_538);
      local_588._0_8_ = local_588 + 0x10;
      psVar12 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar12) {
        local_588._16_8_ = *psVar12;
        local_588._24_8_ = plVar4[3];
      }
      else {
        local_588._16_8_ = *psVar12;
        local_588._0_8_ = (size_type *)*plVar4;
      }
      local_588._8_8_ = plVar4[1];
      *plVar4 = (long)psVar12;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_478,local_588._0_8_);
      if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
        operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
      }
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
      }
      if ((undefined1 **)local_4a0._0_8_ != &local_490) {
        operator_delete((void *)local_4a0._0_8_,(ulong)(local_490 + 1));
      }
      if ((float *)local_508.m_data.m_data[0].m_data._0_8_ != local_508.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_508.m_data.m_data[0].m_data._0_8_,
                        local_508.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_4d8.m_data.m_data[0].m_data._0_8_ != local_4d8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_4d8.m_data.m_data[0].m_data._0_8_,
                        local_4d8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_3b8.m_data.m_data[0].m_data._0_8_ != local_3b8.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_3b8.m_data.m_data[0].m_data._0_8_,
                        local_3b8.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((float *)local_418.m_data.m_data[0].m_data._0_8_ != local_418.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_418.m_data.m_data[0].m_data._0_8_,
                        local_418.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
        operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
      }
      if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
        operator_delete((void *)local_5e0._0_8_,local_5e0._16_8_ + 1);
      }
      if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
        operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
        operator_delete(local_308[0].name._M_dataplus._M_p,
                        local_308[0].name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_560._0_8_ != local_560 + 0x10) {
        operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
      }
      uVar22 = uVar22 + 1;
    } while (local_510 != uVar22);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                 &local_5b8);
  plVar4 = (long *)std::__cxx11::string::append(local_448);
  psVar12 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar12) {
    local_560._16_8_ = *psVar12;
    local_560._24_8_ = plVar4[3];
    local_560._0_8_ = local_560 + 0x10;
  }
  else {
    local_560._16_8_ = *psVar12;
    local_560._0_8_ = (size_type *)*plVar4;
  }
  local_560._8_8_ = plVar4[1];
  *plVar4 = (long)psVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append(local_560,(ulong)local_478);
  local_308[0].name._M_dataplus._M_p = (pointer)&local_308[0].name.field_2;
  psVar12 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_308[0].name.field_2._0_8_ = *psVar12;
    local_308[0].name.field_2._8_8_ = plVar4[3];
  }
  else {
    local_308[0].name.field_2._0_8_ = *psVar12;
    local_308[0].name._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_308[0].name._M_string_length = plVar4[1];
  *plVar4 = (long)psVar12;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)local_308);
  plVar10 = plVar4 + 2;
  if ((long *)*plVar4 == plVar10) {
    local_320 = *plVar10;
    lStack_318 = plVar4[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *plVar10;
    local_330 = (long *)*plVar4;
  }
  local_328 = plVar4[1];
  *plVar4 = (long)plVar10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308[0].name._M_dataplus._M_p != &local_308[0].name.field_2) {
    operator_delete(local_308[0].name._M_dataplus._M_p,
                    local_308[0].name.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_560._0_8_ != local_560 + 0x10) {
    operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,
                    CONCAT44(local_3e8.field_2._M_allocated_capacity._4_4_,
                             local_3e8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
    operator_delete((void *)local_608._0_8_,
                    CONCAT17(local_608[0x17],
                             CONCAT43(local_608._19_4_,CONCAT21(local_608._17_2_,local_608[0x10])))
                    + 1);
  }
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,local_330,local_328 + (long)local_330);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)local_148,(FragmentSource *)local_388);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  sglr::ShaderProgram::ShaderProgram
            (&this->super_ShaderProgram,(ShaderProgramDeclaration *)local_148);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_148);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_007768c8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00776900;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00776918;
  *(int *)&(this->super_ShaderProgram).field_0x154 = numUnits;
  local_390 = &this->m_unitTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_390,local_4a8);
  this_00 = &this->m_transformations;
  local_420 = (vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
              &this->m_lodDerivateParts;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lodDerivateParts).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformations).
  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  deRandom_init(&local_158,randSeed);
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::reserve
            (this_00,(long)*(int *)&(this->super_ShaderProgram).field_0x154);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_420,
             (long)*(int *)&(this->super_ShaderProgram).field_0x154);
  if (0 < *(int *)&(this->super_ShaderProgram).field_0x154) {
    lVar17 = 0;
    do {
      if ((local_390->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar17] == 0xde1) {
        fVar23 = deRandom_getFloat(&local_158);
        local_590._0_4_ = fVar23 * 6.2831855;
        fVar23 = deRandom_getFloat(&local_158);
        local_3bc = fVar23 * 0.8 + 0.7;
        fVar23 = deRandom_getFloat(&local_158);
        local_3c0 = fVar23 * 0.8 + 0.7;
        fVar23 = deRandom_getFloat(&local_158);
        local_510._0_4_ = fVar23 * 0.5;
        fVar23 = deRandom_getFloat(&local_158);
        fVar24 = deRandom_getFloat(&local_158);
        local_4a8._0_4_ = fVar24;
        local_3c4 = deRandom_getFloat(&local_158);
        local_590._0_4_ = local_590._0_4_ + 0.0;
        local_510 = CONCAT44(local_510._4_4_,(float)local_510 + 0.0);
        local_4a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(local_4a8._4_4_,local_4a8._0_4_ + -0.5);
        local_3c4 = local_3c4 + -0.5;
        local_308[0].name.field_2._8_8_ = 0;
        local_308[0].name._M_dataplus._M_p = (pointer)0x3f800000;
        local_308[0].name._M_string_length = 0xbf000000;
        local_308[0].name.field_2._M_allocated_capacity = 0xbf0000003f800000;
        local_308[0].type = 0x3f800000;
        fVar24 = cosf(local_590._0_4_);
        local_148._0_4_ = fVar24;
        fVar24 = sinf(local_590._0_4_);
        local_148._0_8_ = CONCAT44(fVar24,local_148._0_4_) ^ 0x8000000000000000;
        local_148._8_8_ = local_148._8_8_ & 0xffffffff00000000;
        fVar24 = sinf(local_590._0_4_);
        local_148._12_4_ = fVar24;
        local_138 = cosf(local_590._0_4_);
        fStack_134 = 0.0;
        fStack_130 = 0.0;
        fStack_12c = 0.0;
        fStack_128 = 1.0;
        local_608._0_4_ = local_3bc;
        local_608._4_4_ = 0.0;
        local_608._8_4_ = 0.0;
        local_608._12_4_ = 0.0;
        local_608[0x10] = SUB41(local_3c0,0);
        local_608._17_2_ = (undefined2)((uint)local_3c0 >> 8);
        local_608._19_4_ = (uint)local_3c0 >> 0x18;
        local_608[0x17] = '\0';
        local_608._24_2_ = 0;
        local_608[0x1a] = '\0';
        local_608[0x1b] = '\0';
        local_608._28_4_ = 0;
        fStack_5e8 = 1.0;
        local_5b8._M_dataplus._M_p._4_4_ = (float)local_510;
        local_5b8._M_dataplus._M_p._0_4_ = 0x3f800000;
        local_5b8._M_string_length = 0;
        local_5b8.field_2._M_allocated_capacity = 0x3f800000;
        local_5b8.field_2._8_8_ = 0;
        local_598 = 0x3f800000;
        local_478 = (ulong *)0x3f800000;
        local_470 = (ulong)(uint)(fVar23 * 0.5 + 0.0) << 0x20;
        local_468[0] = 0x3f800000;
        local_468[1] = 0;
        local_458 = 0x3f800000;
        local_3e8._M_dataplus._M_p = (pointer)0x3f800000;
        local_3e8._M_string_length._0_4_ = local_4a8._0_4_;
        local_3e8._M_string_length._4_4_ = 0;
        local_3e8.field_2._M_allocated_capacity._0_4_ = 0x3f800000;
        local_3e8.field_2._M_allocated_capacity._4_4_ = local_3c4;
        local_3e8.field_2._8_8_ = 0;
        local_3c8 = 0x3f800000;
        local_508.m_data.m_data[2].m_data[2] = 0.0;
        local_508.m_data.m_data[1].m_data[1] = 0.0;
        local_508.m_data.m_data[1].m_data[2] = 0.0;
        local_508.m_data.m_data[2].m_data[0] = 0.0;
        local_508.m_data.m_data[2].m_data[1] = 0.0;
        local_508.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_508.m_data.m_data[0].m_data[2] = 0.0;
        local_508.m_data.m_data[1].m_data[0] = 0.0;
        pVVar8 = local_308;
        pVVar15 = (Vector<float,_3> *)&local_508;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pVVar19 = pVVar15;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar19->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pVVar8->name)._M_dataplus._M_p + lVar21 * 4);
            lVar21 = lVar21 + 1;
            pVVar19 = pVVar19 + 1;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pVVar15 = (Vector<float,_3> *)(pVVar15->m_data + 1);
          pVVar8 = (VertexAttribute *)((long)&(pVVar8->name)._M_string_length + 4);
        } while (lVar16 != 3);
        local_4d8.m_data.m_data[1].m_data[1] = 0.0;
        local_4d8.m_data.m_data[1].m_data[2] = 0.0;
        local_4d8.m_data.m_data[2].m_data[0] = 0.0;
        local_4d8.m_data.m_data[2].m_data[1] = 0.0;
        local_4d8.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_4d8.m_data.m_data[0].m_data[2] = 0.0;
        local_4d8.m_data.m_data[1].m_data[0] = 0.0;
        local_4d8.m_data.m_data[2].m_data[2] = 0.0;
        pbVar6 = &local_3e8;
        pVVar15 = (Vector<float,_3> *)&local_4d8;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pVVar19 = pVVar15;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar19->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pbVar6->_M_dataplus)._M_p + lVar21 * 4);
            lVar21 = lVar21 + 1;
            pVVar19 = pVVar19 + 1;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pVVar15 = (Vector<float,_3> *)(pVVar15->m_data + 1);
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pbVar6->_M_string_length + 4);
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_4a0,&local_508,&local_4d8);
        local_3b8.m_data.m_data[1].m_data[1] = 0.0;
        local_3b8.m_data.m_data[1].m_data[2] = 0.0;
        local_3b8.m_data.m_data[2].m_data[0] = 0.0;
        local_3b8.m_data.m_data[2].m_data[1] = 0.0;
        local_3b8.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_3b8.m_data.m_data[0].m_data[2] = 0.0;
        local_3b8.m_data.m_data[1].m_data[0] = 0.0;
        local_3b8.m_data.m_data[2].m_data[2] = 0.0;
        puVar5 = local_148;
        pVVar15 = (Vector<float,_3> *)&local_3b8;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pVVar19 = pVVar15;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar19->m_data)->m_data[0].m_data[0] =
                 *(float *)(puVar5 + lVar21 * 4);
            lVar21 = lVar21 + 1;
            pVVar19 = pVVar19 + 1;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pVVar15 = (Vector<float,_3> *)(pVVar15->m_data + 1);
          puVar5 = puVar5 + 0xc;
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_538,(Matrix<float,_3,_3> *)local_4a0,&local_3b8)
        ;
        local_418.m_data.m_data[1].m_data[1] = 0.0;
        local_418.m_data.m_data[1].m_data[2] = 0.0;
        local_418.m_data.m_data[2].m_data[0] = 0.0;
        local_418.m_data.m_data[2].m_data[1] = 0.0;
        local_418.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
        local_418.m_data.m_data[0].m_data[2] = 0.0;
        local_418.m_data.m_data[1].m_data[0] = 0.0;
        local_418.m_data.m_data[2].m_data[2] = 0.0;
        puVar5 = local_608;
        pVVar15 = (Vector<float,_3> *)&local_418;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pVVar19 = pVVar15;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar19->m_data)->m_data[0].m_data[0] =
                 *(float *)(puVar5 + lVar21 * 4);
            lVar21 = lVar21 + 1;
            pVVar19 = pVVar19 + 1;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pVVar15 = (Vector<float,_3> *)(pVVar15->m_data + 1);
          puVar5 = puVar5 + 0xc;
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_588,(Matrix<float,_3,_3> *)local_538,&local_418)
        ;
        local_358._16_8_ = 0;
        local_358._24_8_ = 0;
        local_358._0_8_ = (pointer)0x0;
        local_358._8_8_ = 0;
        local_338 = 0.0;
        pbVar6 = &local_5b8;
        puVar14 = (undefined4 *)local_358;
        lVar16 = 0;
        do {
          lVar21 = 0;
          puVar18 = puVar14;
          do {
            *puVar18 = *(undefined4 *)((long)&(pbVar6->_M_dataplus)._M_p + lVar21 * 4);
            lVar21 = lVar21 + 1;
            puVar18 = puVar18 + 3;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          puVar14 = puVar14 + 1;
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&pbVar6->_M_string_length + 4);
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_5e0,(Matrix<float,_3,_3> *)local_588,
                       (Matrix<float,_3,_3> *)local_358);
        local_388._16_8_ = 0;
        local_388._24_8_ = 0;
        local_388._0_8_ = (pointer)0x0;
        local_388._8_8_ = 0;
        local_368 = 0.0;
        ppuVar7 = &local_478;
        puVar14 = (undefined4 *)local_388;
        lVar16 = 0;
        do {
          lVar21 = 0;
          puVar18 = puVar14;
          do {
            *puVar18 = *(undefined4 *)((long)ppuVar7 + lVar21 * 4);
            lVar21 = lVar21 + 1;
            puVar18 = puVar18 + 3;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          puVar14 = puVar14 + 1;
          ppuVar7 = (ulong **)((long)ppuVar7 + 0xc);
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_448,(Matrix<float,_3,_3> *)local_5e0,
                       (Matrix<float,_3,_3> *)local_388);
        local_188.m_data.m_data[1].m_data[1] = 0.0;
        local_188.m_data.m_data[1].m_data[2] = 0.0;
        local_188.m_data.m_data[2].m_data[0] = 0.0;
        local_188.m_data.m_data[2].m_data[1] = 0.0;
        local_188.m_data.m_data[0].m_data[0] = 0.0;
        local_188.m_data.m_data[0].m_data[1] = 0.0;
        local_188.m_data.m_data[0].m_data[2] = 0.0;
        local_188.m_data.m_data[1].m_data[0] = 0.0;
        local_188.m_data.m_data[2].m_data[2] = 0.0;
        pVVar8 = local_308;
        pVVar15 = (Vector<float,_3> *)&local_188;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pVVar19 = pVVar15;
          do {
            ((Vector<tcu::Vector<float,_3>,_3> *)pVVar19->m_data)->m_data[0].m_data[0] =
                 *(float *)((long)&(pVVar8->name)._M_dataplus._M_p + lVar21 * 4);
            lVar21 = lVar21 + 1;
            pVVar19 = pVVar19 + 1;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pVVar15 = (Vector<float,_3> *)(pVVar15->m_data + 1);
          pVVar8 = (VertexAttribute *)((long)&(pVVar8->name)._M_string_length + 4);
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)&local_330,&local_188,-1.0);
        tcu::operator*((Matrix<float,_3,_3> *)local_560,(Matrix<float,_3,_3> *)local_448,
                       (Matrix<float,_3,_3> *)&local_330);
        calculateLodDerivateParts((Functional *)local_448,(Matrix<float,_3,_3> *)local_560);
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>(local_420,(Vector<float,_4> *)local_448);
        std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                  (this_00,(Matrix<float,_3,_3> *)local_560);
      }
      else {
        uVar22 = 0;
        do {
          if ((uVar22 & 0xb) == 0) {
            fVar23 = deRandom_getFloat(&local_158);
            fVar23 = fVar23 * 0.79999995 + 0.1;
          }
          else {
            fVar23 = 0.0;
            if (uVar22 == 8) {
              local_308[0].type = 0x3f800000;
              break;
            }
          }
          *(float *)((long)&local_308[0].name._M_dataplus._M_p + uVar22 * 4) = fVar23;
          uVar22 = uVar22 + 1;
        } while (uVar22 != 9);
        dVar3 = deRandom_getUint32(&local_158);
        local_138 = 0.0;
        fStack_134 = 0.0;
        fStack_130 = 0.0;
        fStack_12c = 0.0;
        local_148._0_8_ = (pointer)0x0;
        local_148._8_8_ = (pointer)0x0;
        fStack_128 = 0.0;
        pVVar8 = local_308;
        puVar14 = (undefined4 *)local_148;
        lVar16 = 0;
        do {
          lVar21 = 0;
          puVar18 = puVar14;
          do {
            *puVar18 = *(undefined4 *)((long)&(pVVar8->name)._M_dataplus._M_p + lVar21 * 4);
            lVar21 = lVar21 + 1;
            puVar18 = puVar18 + 3;
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          puVar14 = puVar14 + 1;
          pVVar8 = (VertexAttribute *)((long)&(pVVar8->name)._M_string_length + 4);
        } while (lVar16 != 3);
        pfVar9 = MultiTexShader::s_cubeTransforms[dVar3 % 6];
        local_5b8.field_2._M_allocated_capacity = 0;
        local_5b8.field_2._8_8_ = 0;
        local_5b8._M_dataplus._M_p = (pointer)0x0;
        local_5b8._M_string_length = 0;
        local_598 = 0;
        pbVar6 = &local_5b8;
        lVar16 = 0;
        do {
          lVar21 = 0;
          pbVar20 = pbVar6;
          do {
            *(float *)&(pbVar20->_M_dataplus)._M_p = pfVar9[lVar21];
            lVar21 = lVar21 + 1;
            pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&pbVar20->_M_string_length + 4);
          } while (lVar21 != 3);
          lVar16 = lVar16 + 1;
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar6->_M_dataplus)._M_p + 4);
          pfVar9 = pfVar9 + 3;
        } while (lVar16 != 3);
        tcu::operator*((Matrix<float,_3,_3> *)local_608,(Matrix<float,_3,_3> *)&local_5b8,
                       (Mat3 *)local_148);
        calculateLodDerivateParts((Functional *)&local_5b8,(Mat3 *)local_148);
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>(local_420,(Vector<float,_4> *)&local_5b8);
        std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
                  (this_00,(value_type *)local_608);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < *(int *)&(this->super_ShaderProgram).field_0x154);
  }
  return;
}

Assistant:

MultiTexShader::MultiTexShader (deUint32 randSeed, int numUnits, const vector<GLenum>& unitTypes)
	: sglr::ShaderProgram	(generateShaderProgramDeclaration(numUnits, &unitTypes[0]))
	, m_numUnits			(numUnits)
	, m_unitTypes			(unitTypes)
{
	// 2d-to-cube-face transformations.
	// \note 2d coordinates range from 0 to 1 and cube face coordinates from -1 to 1, so scaling is done as well.
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};

	// Generate transformation matrices.

	de::Random rnd(randSeed);

	m_transformations.reserve(m_numUnits);
	m_lodDerivateParts.reserve(m_numUnits);

	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
		{
			float rotAngle				= rnd.getFloat(0.0f, 2.0f*DE_PI);
			float xScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float yScaleFactor			= rnd.getFloat(0.7f, 1.5f);
			float xShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float yShearAmount			= rnd.getFloat(0.0f, 0.5f);
			float xTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);
			float yTranslationAmount	= rnd.getFloat(-0.5f, 0.5f);

			float tempOffsetData[3*3] = // For temporarily centering the coordinates to get nicer transformations.
			{
				1.0f,  0.0f, -0.5f,
				0.0f,  1.0f, -0.5f,
				0.0f,  0.0f,  1.0f
			};
			float rotTransfData[3*3] =
			{
				deFloatCos(rotAngle),	-deFloatSin(rotAngle),	0.0f,
				deFloatSin(rotAngle),	deFloatCos(rotAngle),	0.0f,
				0.0f,					0.0f,					1.0f
			};
			float scaleTransfData[3*3] =
			{
				xScaleFactor,	0.0f,			0.0f,
				0.0f,			yScaleFactor,	0.0f,
				0.0f,			0.0f,			1.0f
			};
			float xShearTransfData[3*3] =
			{
				1.0f,			xShearAmount,	0.0f,
				0.0f,			1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float yShearTransfData[3*3] =
			{
				1.0f,			0.0f,			0.0f,
				yShearAmount,	1.0f,			0.0f,
				0.0f,			0.0f,			1.0f
			};
			float translationTransfData[3*3] =
			{
				1.0f,	0.0f,	xTranslationAmount,
				0.0f,	1.0f,	yTranslationAmount,
				0.0f,	0.0f,	1.0f
			};

			Mat3 transformation =
				Mat3(tempOffsetData) *
				Mat3(translationTransfData) *
				Mat3(rotTransfData) *
				Mat3(scaleTransfData) *
				Mat3(xShearTransfData) *
				Mat3(yShearTransfData) *
				(Mat3(tempOffsetData) * (-1.0f));

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(transformation));

			m_transformations.push_back(transformation);
		}
		else
		{
			DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);
			DE_STATIC_ASSERT((int)tcu::CUBEFACE_LAST == DE_LENGTH_OF_ARRAY(s_cubeTransforms));

			float planarTransData[3*3];

			// In case of a cube map, we only want to render one face, so the transformation needs to be restricted - only enlarging scaling is done.

			for (int i = 0; i < DE_LENGTH_OF_ARRAY(planarTransData); i++)
			{
				if (i == 0 || i == 4)
					planarTransData[i] = rnd.getFloat(0.1f, 0.9f); // Two first diagonal cells control the scaling.
				else if (i == 8)
					planarTransData[i] = 1.0f;
				else
					planarTransData[i] = 0.0f;
			}

			int		faceNdx			= rnd.getInt(0, (int)tcu::CUBEFACE_LAST - 1);
			Mat3	planarTrans		(planarTransData);									// Planar, face-agnostic transformation.
			Mat3	finalTrans		= Mat3(s_cubeTransforms[faceNdx]) * planarTrans;	// Final transformation from planar to cube map coordinates, including the transformation just generated.

			// Calculate parts of lod derivates.
			m_lodDerivateParts.push_back(calculateLodDerivateParts(planarTrans));

			m_transformations.push_back(finalTrans);
		}
	}
}